

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<5>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<5> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  Base::Base(&this->super_Base,head,MAT,5);
  readSequence<njoy::ENDFtk::section::Type<5>::PartialDistribution,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->partials_,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,5,*(int *)(head + 0x38),*(int *)(head + 8),
             (int)&this->partials_);
  verifyNK((int)(((long)(this->partials_).
                        super__Vector_base<njoy::ENDFtk::section::Type<5>::PartialDistribution,_std::allocator<njoy::ENDFtk::section::Type<5>::PartialDistribution>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->partials_).
                       super__Vector_base<njoy::ENDFtk::section::Type<5>::PartialDistribution,_std::allocator<njoy::ENDFtk::section::Type<5>::PartialDistribution>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x1b8));
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,5);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try:
    Base( head, MAT, 5 ),
    partials_( readSequence< PartialDistribution >(
                   begin, end, lineNumber,
                   MAT, 5, head.MT(), head.N1() ) ) {
    verifyNK( this->NK() );
    readSEND( begin, end, lineNumber, MAT, 5 );
  } catch( std::exception& e ) {
    Log::info( "Trouble while reading section {} of File 5 of Material {}",
               head.MT(), MAT );
    throw e;
  }